

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O2

int get_layer_order(vector<int,_std::allocator<int>_> *layers,
                   map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                   *layer_info)

{
  _Rb_tree_color *p_Var1;
  _Rb_tree_node_base *p_Var2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  pointer __k;
  _Rb_tree_color *p_Var6;
  
  for (__k = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
      __k != (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish; __k = __k + 1) {
    pmVar3 = std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::operator[](layer_info,__k);
    *__k = pmVar3->order;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start);
  p_Var1 = (_Rb_tree_color *)
           (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  p_Var2 = (layer_info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(layer_info->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var6 = (_Rb_tree_color *)
                (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; p_Var4 = p_Var2, p_Var6 != p_Var1;
      p_Var6 = p_Var6 + 1) {
    while ((_Rb_tree_header *)p_Var4 != p_Var5) {
      if (*(_Rb_tree_color *)((long)&p_Var4[2]._M_parent + 4) == *p_Var6) {
        *p_Var6 = p_Var4[1]._M_color;
        p_Var4 = &p_Var5->_M_header;
      }
      else {
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      }
    }
  }
  return 0;
}

Assistant:

int get_layer_order(vector<int> &layers, map<int, layer_data> &layer_info)
{
  // Translate layer numbers to order
  auto layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // int order = layer_info[*layer_it].order;
    *layer_it = layer_info[*layer_it].order;
    layer_it++;
  }
  sort(layers.begin(), layers.end());
  // Translate back to layer
  layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // search through map for matching order
    auto ldf_iter = layer_info.begin();
    while (ldf_iter != layer_info.end())
    {
      if (ldf_iter->second.order == *layer_it)
      {
        *layer_it = ldf_iter->first;
        ldf_iter = layer_info.end();
      }
      else
      {
        ldf_iter++;
      }
    }
    layer_it++;
  }
  return EXIT_SUCCESS;
}